

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastGdR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long v1;
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  TcParseTableBase *field;
  TcParseTableBase *table_00;
  MessageLite *pMVar5;
  ulong uVar6;
  Nonnull<const_char_*> failure_msg;
  char *pcVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  MessageLite *unaff_RBX;
  int iVar9;
  TcParseTableBase *ptr_00;
  uint *puVar10;
  int iVar11;
  long v1_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  LogMessageFatal local_78;
  uint64_t local_68;
  MessageLite *local_60;
  ClassData *local_58;
  ushort uVar14;
  undefined2 uVar15;
  
  if (data.field_0._0_2_ != 0) {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  field = (TcParseTableBase *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)field & 7) != 0) {
    AlignFail(field);
  }
  uVar14 = *(ushort *)ptr;
  local_68 = hasbits;
  local_60 = msg;
  local_58 = (ClassData *)table;
  table_00 = MessageLite::GetTcParseTable
                       (*(MessageLite **)
                         ((long)&table->has_bits_offset +
                         ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  uVar15 = 0;
  aVar8._0_4_ = (int)(char)uVar14 + (uint)uVar14 >> 1;
  aVar8.data._4_4_ = 0;
  uVar4 = aVar8._0_4_;
  do {
    ptr_00 = field;
    pMVar5 = AddMessage(table_00,(RepeatedPtrFieldBase *)field);
    auVar12._8_8_ = extraout_RDX;
    auVar12._0_8_ = local_78.super_LogMessage._0_8_;
    iVar11 = ctx->depth_;
    v1 = (long)iVar11 + -1;
    iVar9 = (int)v1;
    ctx->depth_ = iVar9;
    if ((long)iVar11 < 1) {
      ptr = (char *)0x0;
    }
    else {
      v1_00 = (long)ctx->group_depth_ + 1;
      iVar11 = (int)v1_00;
      ctx->group_depth_ = iVar11;
      local_78.super_LogMessage._0_8_ = &((TcParseTableBase *)ptr)->extension_offset;
      while( true ) {
        ptr_00 = (TcParseTableBase *)&local_78;
        bVar2 = EpsCopyInputStream::DoneWithCheck<false>
                          (&ctx->super_EpsCopyInputStream,(char **)&local_78,ctx->group_depth_);
        auVar12._8_8_ = extraout_RDX_00;
        auVar12._0_8_ = local_78.super_LogMessage._0_8_;
        if (bVar2) break;
        uVar3 = (uint)table_00->fast_idx_mask &
                (uint)*(ushort *)(void **)local_78.super_LogMessage._0_8_;
        if ((uVar3 & 7) != 0) goto LAB_00fb89aa;
        uVar6 = (ulong)(uVar3 & 0xfffffff8);
        aVar8.data = (ulong)*(ushort *)(void **)local_78.super_LogMessage._0_8_ ^
                     *(ulong *)(&table_00[1].fast_idx_mask + uVar6 * 2);
        auVar12 = (**(code **)(&table_00[1].has_bits_offset + uVar6))
                            (pMVar5,local_78.super_LogMessage._0_8_,ctx,aVar8.data,table_00,0);
        ptr_00 = (TcParseTableBase *)local_78.super_LogMessage._0_8_;
        if ((auVar12._0_8_ == (TcParseTableBase *)0x0) ||
           (local_78.super_LogMessage._0_8_ = auVar12._0_8_,
           (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
      }
      local_78.super_LogMessage._0_8_ = auVar12._0_8_;
      if ((table_00->field_0x9 & 1) == 0) {
        ptr = (char *)local_78.super_LogMessage._0_8_;
        if ((TcParseTableBase *)local_78.super_LogMessage._0_8_ == (TcParseTableBase *)0x0) {
          ptr_00 = table_00;
          VerifyHasBitConsistency
                    (unaff_RBX,(TcParseTableBase *)CONCAT26(uVar15,CONCAT24(uVar14,uVar4)));
          auVar12._8_8_ = extraout_RDX_01;
          auVar12._0_8_ = local_78.super_LogMessage._0_8_;
          ptr = (char *)local_78.super_LogMessage._0_8_;
        }
      }
      else {
        ptr_00 = (TcParseTableBase *)local_78.super_LogMessage._0_8_;
        auVar13 = (undefined1  [16])
                  (*table_00->post_loop_handler)(pMVar5,(char *)local_78.super_LogMessage._0_8_,ctx)
        ;
        auVar12._8_8_ = auVar13._8_8_;
        auVar12._0_8_ = local_78.super_LogMessage._0_8_;
        ptr = (char *)auVar13._0_8_;
      }
      local_78.super_LogMessage._0_8_ = auVar12._0_8_;
      if ((TcParseTableBase *)ptr != (TcParseTableBase *)0x0) {
        if (iVar9 == ctx->depth_) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (v1,(long)ctx->depth_,"old_depth == depth_");
          auVar12._8_8_ = extraout_RDX_02;
          auVar12._0_8_ = local_78.super_LogMessage._0_8_;
        }
        local_78.super_LogMessage._0_8_ = auVar12._0_8_;
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          iVar11 = 0x491;
LAB_00fb89e8:
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,iVar11,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_78);
        }
        ptr_00 = (TcParseTableBase *)(long)ctx->group_depth_;
        if (iVar11 == ctx->group_depth_) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (v1_00,(long)ptr_00,"old_group_depth == group_depth_");
          auVar12._8_8_ = extraout_RDX_03;
          auVar12._0_8_ = local_78.super_LogMessage._0_8_;
        }
        local_78.super_LogMessage._0_8_ = auVar12._0_8_;
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          iVar11 = 0x492;
          goto LAB_00fb89e8;
        }
      }
      ctx->group_depth_ = ctx->group_depth_ + -1;
      ctx->depth_ = ctx->depth_ + 1;
      uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      if (uVar3 != uVar4) {
        ptr = (char *)0x0;
      }
    }
    local_78.super_LogMessage._0_8_ = auVar12._0_8_;
    if ((TcParseTableBase *)ptr == (TcParseTableBase *)0x0) {
      pcVar7 = Error(local_60,(char *)ptr_00,auVar12._8_8_,(TcFieldData)aVar8,
                     (TcParseTableBase *)local_58,local_68);
      return pcVar7;
    }
    if ((TcParseTableBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)*(ushort *)&local_58->prototype != 0) {
        puVar10 = (uint *)((long)&local_60->_vptr_MessageLite +
                          (ulong)*(ushort *)&local_58->prototype);
        if (((ulong)puVar10 & 3) != 0) {
          AlignFail();
        }
        *puVar10 = *puVar10 | (uint)local_68;
      }
      return (char *)(TcParseTableBase *)ptr;
    }
    uVar1 = ((TcParseTableBase *)ptr)->has_bits_offset;
    aVar8.data._2_6_ = 0;
    aVar8.data._0_2_ = uVar1;
    if (uVar1 != uVar14) {
      uVar4 = (uint)*(byte *)&local_58->tc_table & (uint)uVar1;
      if ((uVar4 & 7) == 0) {
        uVar6 = (ulong)(uVar4 & 0xfffffff8);
        pcVar7 = (char *)(**(code **)((long)&local_58->cached_size_offset + uVar6 * 2))
                                   (local_60,ptr,ctx,
                                    aVar8.data ^
                                    *(ulong *)((long)&local_58[1].prototype + uVar6 * 2),local_58,
                                    local_68);
        return pcVar7;
      }
LAB_00fb89aa:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}